

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O2

void aom_highbd_dc_left_predictor_8x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar4 [16];
  __m128i dc;
  short sVar3;
  short sVar5;
  short sVar6;
  short sVar7;
  
  auVar1 = *(undefined1 (*) [16])left;
  sVar3 = auVar1._8_2_;
  auVar4._0_2_ = sVar3 + auVar1._0_2_;
  sVar5 = auVar1._10_2_;
  auVar4._2_2_ = sVar5 + auVar1._2_2_;
  sVar6 = auVar1._12_2_;
  auVar4._4_2_ = sVar6 + auVar1._4_2_;
  sVar7 = auVar1._14_2_;
  auVar4._6_2_ = sVar7 + auVar1._6_2_;
  auVar4._8_2_ = sVar3;
  auVar4._10_2_ = sVar5;
  auVar4._12_2_ = sVar6;
  auVar4._14_2_ = sVar7;
  auVar1 = pshuflw(auVar1,auVar4,0xe);
  auVar2._0_2_ = auVar1._0_2_ + auVar4._0_2_;
  auVar2._2_2_ = auVar1._2_2_ + auVar4._2_2_;
  auVar2._4_2_ = auVar1._4_2_ + auVar4._4_2_;
  auVar2._6_2_ = auVar1._6_2_ + auVar4._6_2_;
  auVar2._8_2_ = auVar1._8_2_ + sVar3;
  auVar2._10_2_ = auVar1._10_2_ + sVar5;
  auVar2._12_2_ = auVar1._12_2_ + sVar6;
  auVar2._14_2_ = auVar1._14_2_ + sVar7;
  auVar1 = pshuflw(auVar4,auVar2,1);
  dc[0]._0_2_ = (ushort)(auVar1._0_2_ + auVar2._0_2_ + 4U) >> 3;
  dc[0]._2_2_ = (ushort)(auVar1._2_2_ + auVar2._2_2_) >> 3;
  dc[0]._4_2_ = (ushort)(auVar1._4_2_ + auVar2._4_2_) >> 3;
  dc[0]._6_2_ = (ushort)(auVar1._6_2_ + auVar2._6_2_) >> 3;
  dc[1]._0_2_ = (ushort)(auVar1._8_2_ + auVar2._8_2_) >> 3;
  dc[1]._2_2_ = (ushort)(auVar1._10_2_ + auVar2._10_2_) >> 3;
  dc[1]._4_2_ = (ushort)(auVar1._12_2_ + auVar2._12_2_) >> 3;
  dc[1]._6_2_ = (ushort)(auVar1._14_2_ + auVar2._14_2_) >> 3;
  dc_store_8xh(dst,stride,8,&dc);
  return;
}

Assistant:

void aom_highbd_dc_left_predictor_8x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                           const uint16_t *above,
                                           const uint16_t *left, int bd) {
  const __m128i four = _mm_cvtsi32_si128(4);
  const __m128i sum = dc_sum_8(left);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, four), 3);
  (void)above;
  (void)bd;
  dc_store_8xh(dst, stride, 8, &dc);
}